

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

Dimensions ftxui::Dimension::Fit(Element *e)

{
  Dimensions DVar1;
  element_type *peVar2;
  int *piVar3;
  Requirement local_fc;
  Requirement local_d0;
  undefined8 local_a4;
  undefined8 local_9c;
  Requirement local_94;
  Requirement local_68;
  undefined4 local_3c;
  int local_38;
  int max_iteration;
  Status status;
  Box box;
  Dimensions fullsize;
  Element *e_local;
  
  box._8_8_ = Full();
  Box::Box((Box *)&status);
  status.iteration = 0;
  box.x_min = 0;
  status._4_4_ = box.y_min;
  box.x_max = box.y_max;
  Node::Status::Status((Status *)&stack0xffffffffffffffc8);
  peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      e);
  (*peVar2->_vptr_Node[5])(peVar2,&stack0xffffffffffffffc8);
  local_3c = 0x14;
  while (((byte)max_iteration & 1) != 0 && local_38 < 0x14) {
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)e);
    (*peVar2->_vptr_Node[2])();
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)e);
    Node::requirement(&local_68,peVar2);
    piVar3 = std::min<int>((int *)&status.need_iteration,&local_68.min_x);
    status._4_4_ = *piVar3;
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)e);
    Node::requirement(&local_94,peVar2);
    piVar3 = std::min<int>(&box.x_max,&local_94.min_y);
    box.x_max = *piVar3;
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)e);
    local_a4 = CONCAT44(status._4_4_,status.iteration);
    local_9c = CONCAT44(box.x_max,box.x_min);
    (*peVar2->_vptr_Node[3])(peVar2,local_a4,local_9c);
    max_iteration._0_1_ = 0;
    local_38 = local_38 + 1;
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)e);
    (*peVar2->_vptr_Node[5])(peVar2,&stack0xffffffffffffffc8);
    if (((byte)max_iteration & 1) == 0) break;
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)e);
    Node::requirement(&local_d0,peVar2);
    piVar3 = std::min<int>(&local_d0.min_x,&box.y_min);
    status._4_4_ = *piVar3;
    peVar2 = std::__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ftxui::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)e);
    Node::requirement(&local_fc,peVar2);
    piVar3 = std::min<int>(&local_fc.min_y,&box.y_max);
    box.x_max = *piVar3;
  }
  DVar1.dimy = box.x_max;
  DVar1.dimx = status._4_4_;
  return DVar1;
}

Assistant:

Dimensions Dimension::Fit(Element& e) {
  const Dimensions fullsize = Dimension::Full();
  Box box;
  box.x_min = 0;
  box.y_min = 0;
  box.x_max = fullsize.dimx;
  box.y_max = fullsize.dimy;

  Node::Status status;
  e->Check(&status);
  const int max_iteration = 20;
  while (status.need_iteration && status.iteration < max_iteration) {
    e->ComputeRequirement();

    // Don't give the element more space than it needs:
    box.x_max = std::min(box.x_max, e->requirement().min_x);
    box.y_max = std::min(box.y_max, e->requirement().min_y);

    e->SetBox(box);
    status.need_iteration = false;
    status.iteration++;
    e->Check(&status);

    if (!status.need_iteration) {
      break;
    }
    // Increase the size of the box until it fits, but not more than the with of
    // the terminal emulator:
    box.x_max = std::min(e->requirement().min_x, fullsize.dimx);
    box.y_max = std::min(e->requirement().min_y, fullsize.dimy);
  }

  return {
      box.x_max,
      box.y_max,
  };
}